

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input_.cxx
# Opt level: O0

void __thiscall
Fl_Input_::handle_mouse(Fl_Input_ *this,int X,int Y,int param_3,int param_4,int drag)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  double dVar5;
  int local_4bc;
  int local_48c;
  int local_480;
  int newmark;
  int cw_1;
  double f1;
  int cw;
  double f;
  double f0;
  char *t;
  char *r;
  char *l;
  int newpos;
  int theline;
  char buf [1024];
  char *e;
  char *p;
  int drag_local;
  int param_4_local;
  int param_3_local;
  int Y_local;
  int X_local;
  Fl_Input_ *this_local;
  
  was_up_down = 0;
  iVar1 = size(this);
  if (iVar1 == 0) {
    return;
  }
  setfont(this);
  iVar1 = input_type(this);
  if (iVar1 == 4) {
    iVar2 = Fl::event_y();
    iVar1 = this->yscroll_;
    local_48c = fl_height();
    local_48c = ((iVar2 - Y) + iVar1) / local_48c;
  }
  else {
    local_48c = 0;
  }
  l._4_4_ = local_48c;
  e = value(this);
  while( true ) {
    buf._1016_8_ = expand(this,e,(char *)&newpos);
    l._4_4_ = l._4_4_ + -1;
    if ((l._4_4_ < 0) || (this->value_ + this->size_ <= (ulong)buf._1016_8_)) break;
    e = (char *)(buf._1016_8_ + 1);
  }
  iVar1 = Fl::event_x();
  f = (double)((iVar1 - X) + this->xscroll_);
  r = e;
  t = (char *)buf._1016_8_;
  while (r < t) {
    f1._4_4_ = fl_utf8len(*r);
    if (f1._4_4_ < 1) {
      f1._4_4_ = 1;
    }
    pcVar4 = r + f1._4_4_;
    iVar1 = this->xscroll_;
    dVar5 = expandpos(this,e,pcVar4,(char *)&newpos,(int *)0x0);
    dVar5 = (double)(X - iVar1) + dVar5;
    iVar1 = Fl::event_x();
    if ((double)iVar1 < dVar5) {
      t = pcVar4 + -(long)f1._4_4_;
    }
    else {
      iVar1 = Fl::event_x();
      f = (double)iVar1 - dVar5;
      r = pcVar4;
    }
  }
  if ((r < (ulong)buf._1016_8_) && (iVar1 = fl_utf8len(*r), 0 < iVar1)) {
    iVar2 = this->xscroll_;
    dVar5 = expandpos(this,e,r + iVar1,(char *)&newpos,(int *)0x0);
    iVar3 = Fl::event_x();
    if (((double)(X - iVar2) + dVar5) - (double)iVar3 < f) {
      r = r + iVar1;
    }
  }
  pcVar4 = value(this);
  l._0_4_ = (int)r - (int)pcVar4;
  local_4bc = (int)l;
  if (drag != 0) {
    local_4bc = mark(this);
  }
  local_480 = local_4bc;
  iVar1 = Fl::event_clicks();
  if (iVar1 != 0) {
    if ((int)l < local_4bc) {
      iVar1 = Fl::event_clicks();
      if (iVar1 < 2) {
        pcVar4 = value(this);
        iVar1 = input_type(this);
        l._0_4_ = strict_word_start(pcVar4,(int)l,iVar1);
        pcVar4 = value(this);
        iVar1 = size(this);
        iVar2 = input_type(this);
        local_480 = strict_word_end(pcVar4,iVar1,local_4bc,iVar2);
      }
      else {
        l._0_4_ = line_start(this,(int)l);
        local_480 = line_end(this,local_4bc);
      }
    }
    else {
      if ((int)l == local_4bc) {
        iVar1 = size(this);
        if ((int)l < iVar1) {
          l._0_4_ = (int)l + 1;
        }
        else {
          local_480 = local_4bc + -1;
        }
      }
      iVar1 = Fl::event_clicks();
      if (iVar1 < 2) {
        pcVar4 = value(this);
        iVar1 = size(this);
        iVar2 = input_type(this);
        l._0_4_ = strict_word_end(pcVar4,iVar1,(int)l,iVar2);
        pcVar4 = value(this);
        iVar1 = input_type(this);
        local_480 = strict_word_start(pcVar4,local_480,iVar1);
      }
      else {
        l._0_4_ = line_end(this,(int)l);
        local_480 = line_start(this,local_480);
      }
    }
    if (drag == 0) {
      iVar1 = mark(this);
      iVar2 = position(this);
      if (iVar2 < iVar1) {
        iVar1 = position(this);
        if (local_480 < iVar1) goto LAB_001f9d23;
        iVar1 = mark(this);
      }
      else {
        iVar1 = mark(this);
        if (local_480 < iVar1) goto LAB_001f9d23;
        iVar1 = position(this);
      }
      if ((int)l <= iVar1) {
        Fl::event_clicks(0);
        pcVar4 = value(this);
        local_480 = (int)r - (int)pcVar4;
        l._0_4_ = local_480;
      }
    }
  }
LAB_001f9d23:
  position(this,(int)l,local_480);
  return;
}

Assistant:

void Fl_Input_::handle_mouse(int X, int Y, int /*W*/, int /*H*/, int drag) {
  was_up_down = 0;
  if (!size()) return;
  setfont();

  const char *p, *e;
  char buf[MAXBUF];

  int theline = (input_type()==FL_MULTILINE_INPUT) ?
    (Fl::event_y()-Y+yscroll_)/fl_height() : 0;

  int newpos = 0;
  for (p=value();; ) {
    e = expand(p, buf);
    theline--; if (theline < 0) break;
    if (e >= value_+size_) break;
    p = e+1;
  }
  const char *l, *r, *t; double f0 = Fl::event_x()-X+xscroll_;
  for (l = p, r = e; l<r; ) {
    double f;
    int cw = fl_utf8len((char)l[0]);
    if (cw < 1) cw = 1;
    t = l+cw;
    f = X-xscroll_+expandpos(p, t, buf, 0);
    if (f <= Fl::event_x()) {l = t; f0 = Fl::event_x()-f;}
    else r = t-cw;
  }
  if (l < e) { // see if closer to character on right:
    double f1;
    int cw = fl_utf8len((char)l[0]);
    if (cw > 0) {
      f1 = X-xscroll_+expandpos(p, l + cw, buf, 0) - Fl::event_x();
      if (f1 < f0) l = l+cw;
    }
  }
  newpos = (int) (l-value());

  int newmark = drag ? mark() : newpos;
  if (Fl::event_clicks()) {
    if (newpos >= newmark) {
      if (newpos == newmark) {
	if (newpos < size()) newpos++;
	else newmark--;
      }
      if (Fl::event_clicks() > 1) {
	newpos = line_end(newpos);
	newmark = line_start(newmark);
      } else {
	newpos = strict_word_end(value(), size(), newpos, input_type());
	newmark = strict_word_start(value(), newmark, input_type());
      }
    } else {
      if (Fl::event_clicks() > 1) {
	newpos = line_start(newpos);
	newmark = line_end(newmark);
      } else {
	newpos = strict_word_start(value(), newpos, input_type());
	newmark = strict_word_end(value(), size(), newmark, input_type());
      }
    }
    // if the multiple click does not increase the selection, revert
    // to single-click behavior:
    if (!drag && (mark() > position() ?
                  (newmark >= position() && newpos <= mark()) :
                  (newmark >= mark() && newpos <= position()))) {
      Fl::event_clicks(0);
      newmark = newpos = (int) (l-value());
    }
  }
  position(newpos, newmark);
}